

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cRGB,cBGRA,bBlend>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  EBlend EVar4;
  FSpecialColormap *pFVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  byte *pbVar14;
  
  pFVar5 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_004cb1a5_caseD_0:
    lVar10 = 0;
    if (count < 1) {
      count = 0;
    }
    pbVar14 = pin + 2;
    for (; count != (int)lVar10; lVar10 = lVar10 + 1) {
      pout[lVar10 * 4 + 2] =
           (BYTE)((uint)pbVar14[-2] * inf->alpha + (uint)pout[lVar10 * 4 + 2] * inf->invalpha >>
                 0x10);
      pout[lVar10 * 4 + 1] =
           (BYTE)((uint)pbVar14[-1] * inf->alpha + (uint)pout[lVar10 * 4 + 1] * inf->invalpha >>
                 0x10);
      pout[lVar10 * 4] =
           (BYTE)((uint)*pbVar14 * inf->alpha + (uint)pout[lVar10 * 4] * inf->invalpha >> 0x10);
      pout[lVar10 * 4 + 3] = 0xff;
      pbVar14 = pbVar14 + step;
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_004cb1a5_caseD_0;
    case BLEND_ICEMAP:
      lVar10 = 0;
      if (count < 1) {
        count = 0;
      }
      for (; count != (int)lVar10; lVar10 = lVar10 + 1) {
        iVar11 = cRGB::Gray(pin);
        iVar11 = iVar11 >> 4;
        pout[lVar10 * 4 + 2] =
             (BYTE)((uint)IcePalette[iVar11][0] * inf->alpha +
                    (uint)pout[lVar10 * 4 + 2] * inf->invalpha >> 0x10);
        pout[lVar10 * 4 + 1] =
             (BYTE)((uint)IcePalette[iVar11][1] * inf->alpha +
                    (uint)pout[lVar10 * 4 + 1] * inf->invalpha >> 0x10);
        pout[lVar10 * 4] =
             (BYTE)((uint)IcePalette[iVar11][2] * inf->alpha +
                    (uint)pout[lVar10 * 4] * inf->invalpha >> 0x10);
        pout[lVar10 * 4 + 3] = 0xff;
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      lVar10 = 0;
      if (count < 1) {
        count = 0;
      }
      pbVar14 = pin + 2;
      for (; count != (int)lVar10; lVar10 = lVar10 + 1) {
        iVar11 = inf->blendcolor[3];
        bVar1 = pbVar14[-1];
        iVar7 = inf->blendcolor[1];
        bVar2 = *pbVar14;
        iVar3 = inf->blendcolor[2];
        pout[lVar10 * 4 + 2] =
             (BYTE)(((uint)pbVar14[-2] * iVar11 + inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                    (uint)pout[lVar10 * 4 + 2] * inf->invalpha >> 0x10);
        pout[lVar10 * 4 + 1] =
             (BYTE)(((uint)bVar1 * iVar11 + iVar7 >> 0x10 & 0xff) * inf->alpha +
                    (uint)pout[lVar10 * 4 + 1] * inf->invalpha >> 0x10);
        pout[lVar10 * 4] =
             (BYTE)(((uint)bVar2 * iVar11 + iVar3 >> 0x10 & 0xff) * inf->alpha +
                    (uint)pout[lVar10 * 4] * inf->invalpha >> 0x10);
        pout[lVar10 * 4 + 3] = 0xff;
        pbVar14 = pbVar14 + step;
      }
      break;
    case BLEND_MODULATE:
      lVar10 = 0;
      if (count < 1) {
        count = 0;
      }
      pbVar14 = pin + 2;
      for (; count != (int)lVar10; lVar10 = lVar10 + 1) {
        bVar1 = pbVar14[-1];
        iVar11 = inf->blendcolor[1];
        bVar2 = *pbVar14;
        iVar7 = inf->blendcolor[2];
        pout[lVar10 * 4 + 2] =
             (BYTE)(((uint)pbVar14[-2] * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                    (uint)pout[lVar10 * 4 + 2] * inf->invalpha >> 0x10);
        pout[lVar10 * 4 + 1] =
             (BYTE)(((uint)bVar1 * iVar11 >> 0x10 & 0xff) * inf->alpha +
                    (uint)pout[lVar10 * 4 + 1] * inf->invalpha >> 0x10);
        pout[lVar10 * 4] =
             (BYTE)(((uint)bVar2 * iVar7 >> 0x10 & 0xff) * inf->alpha +
                    (uint)pout[lVar10 * 4] * inf->invalpha >> 0x10);
        pout[lVar10 * 4 + 3] = 0xff;
        pbVar14 = pbVar14 + step;
      }
      break;
    default:
      EVar4 = inf->blend;
      lVar10 = (long)EVar4;
      if (lVar10 < 0x21) {
        if (BLEND_ICEMAP < EVar4) {
          iVar11 = 0x20 - EVar4;
          uVar13 = 0;
          uVar9 = (ulong)(uint)count;
          if (count < 1) {
            uVar9 = uVar13;
          }
          for (; (int)uVar9 != (int)uVar13; uVar13 = uVar13 + 1) {
            iVar7 = cRGB::Gray(pin);
            iVar7 = iVar7 * (EVar4 + BLEND_MODULATE);
            bVar1 = pin[1];
            bVar2 = pin[2];
            pout[uVar13 * 4 + 2] =
                 (BYTE)(((int)((uint)*pin * iVar11 + iVar7) / 0x1f & 0xffU) * inf->alpha +
                        (uint)pout[uVar13 * 4 + 2] * inf->invalpha >> 0x10);
            pout[uVar13 * 4 + 1] =
                 (BYTE)(((int)((uint)bVar1 * iVar11 + iVar7) / 0x1f & 0xffU) * inf->alpha +
                        (uint)pout[uVar13 * 4 + 1] * inf->invalpha >> 0x10);
            pout[uVar13 * 4] =
                 (BYTE)(((int)((uint)bVar2 * iVar11 + iVar7) / 0x1f & 0xffU) * inf->alpha +
                        (uint)pout[uVar13 * 4] * inf->invalpha >> 0x10);
            pout[uVar13 * 4 + 3] = 0xff;
            pin = pin + step;
          }
        }
      }
      else {
        if (count < 1) {
          count = 0;
        }
        for (lVar12 = 0; count != (int)lVar12; lVar12 = lVar12 + 1) {
          uVar6 = cRGB::Gray(pin);
          uVar8 = 0xff;
          if (uVar6 < 0xff) {
            uVar8 = uVar6;
          }
          if ((int)uVar6 < 1) {
            uVar8 = 0;
          }
          uVar9 = (ulong)uVar8;
          bVar1 = *(byte *)((long)pFVar5 + uVar9 * 4 + lVar10 * 0x518 + -0xa700);
          bVar2 = *(byte *)((long)pFVar5 + uVar9 * 4 + lVar10 * 0x518 + -0xa6ff);
          pout[lVar12 * 4 + 2] =
               (BYTE)((uint)*(byte *)((long)pFVar5 + uVar9 * 4 + lVar10 * 0x518 + -0xa6fe) *
                      inf->alpha + (uint)pout[lVar12 * 4 + 2] * inf->invalpha >> 0x10);
          pout[lVar12 * 4 + 1] =
               (BYTE)((uint)bVar2 * inf->alpha + (uint)pout[lVar12 * 4 + 1] * inf->invalpha >> 0x10)
          ;
          pout[lVar12 * 4] =
               (BYTE)((uint)bVar1 * inf->alpha + (uint)pout[lVar12 * 4] * inf->invalpha >> 0x10);
          pout[lVar12 * 4 + 3] = 0xff;
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}